

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logging.cpp
# Opt level: O0

void __thiscall Logger::Impl::formatTime(Impl *this)

{
  tm *__tp;
  tm *p_time;
  char str_t [26];
  time_t time;
  timeval tv;
  Impl *this_local;
  
  tv.tv_usec = (__suseconds_t)this;
  memset(&p_time,0,0x1a);
  gettimeofday((timeval *)&time,(__timezone_ptr_t)0x0);
  stack0xffffffffffffffd8 = time;
  __tp = localtime((time_t *)(str_t + 0x18));
  strftime((char *)&p_time,0x1a,"%Y-%m-%d %H:%M:%S\n",__tp);
  LogStream::operator<<(&this->stream_,(char *)&p_time);
  LogStream::operator<<(&this->stream_,"+-----------------------+\n");
  return;
}

Assistant:

void Logger::Impl::formatTime()
{
    struct timeval tv;
    time_t time;
    char str_t[26] = {0};
    gettimeofday (&tv, NULL);
    time = tv.tv_sec;
    struct tm* p_time = localtime(&time);   
    strftime(str_t, 26, "%Y-%m-%d %H:%M:%S\n", p_time);
    stream_ << str_t;
    stream_ << "+-----------------------+\n";

}